

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_state.cpp
# Opt level: O2

void __thiscall
duckdb::PartitionLocalSinkState::Sink(PartitionLocalSinkState *this,DataChunk *input_chunk)

{
  DataChunk *pDVar1;
  atomic<unsigned_long> *paVar2;
  LocalSortStatePtr *this_00;
  unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
  *this_01;
  pointer puVar3;
  pointer puVar4;
  unsafe_unique_array<UnifiedVectorFormat> col_data;
  pointer pRVar5;
  int iVar6;
  pointer pLVar7;
  reference this_02;
  type this_03;
  idx_t iVar8;
  type global_sort_state;
  undefined4 extraout_var;
  _Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false> _Var9;
  pointer pRVar10;
  type string_heap;
  reference pvVar11;
  reference other;
  pointer this_04;
  type state;
  SelectionVector *pSVar12;
  reference this_05;
  pointer this_06;
  BlockHandle *pBVar13;
  size_t i;
  ulong uVar14;
  bool local_e9;
  unsafe_unique_array<UnifiedVectorFormat> input_data;
  pointer local_d8;
  uint local_cc;
  vector<duckdb::BufferHandle,_true> handles;
  LogicalType local_b0;
  Vector addresses;
  
  LOCK();
  paVar2 = &this->gstate->count;
  (paVar2->super___atomic_base<unsigned_long>)._M_i =
       (paVar2->super___atomic_base<unsigned_long>)._M_i + input_chunk->count;
  UNLOCK();
  if (this->sort_cols == 0) {
    this_01 = &this->rows;
    if ((this->rows).
        super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
        .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl ==
        (RowDataCollection *)0x0) {
      uVar14 = (this->payload_layout).row_width;
      addresses._0_8_ = uVar14;
      iVar6 = (*this->gstate->buffer_manager->_vptr_BufferManager[0xf])();
      handles.super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
      super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CONCAT44(extraout_var,iVar6);
      _Var9._M_head_impl =
           (UnifiedVectorFormat *)
           ((ulong)handles.super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>
                   .super__Vector_base<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>.
                   _M_impl.super__Vector_impl_data._M_start / uVar14 + 1);
      input_data.
      super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
      .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl =
           (unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
            )(__uniq_ptr_data<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>,_true,_true>
              )(_Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>)0x800;
      if (0x800 < _Var9._M_head_impl) {
        input_data.
        super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
        .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl =
             (unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
              )(unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
                )_Var9._M_head_impl;
      }
      make_uniq<duckdb::RowDataCollection,duckdb::BufferManager&,unsigned_long_const&,unsigned_long_const&>
                ((duckdb *)&local_d8,this->gstate->buffer_manager,(unsigned_long *)&input_data,
                 (unsigned_long *)&addresses);
      pRVar5 = local_d8;
      local_d8 = (pointer)0x0;
      ::std::
      __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
      reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
             *)this_01,pRVar5);
      ::std::unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
      ::~unique_ptr((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                     *)&local_d8);
      local_cc = 1;
      local_e9 = true;
      make_uniq<duckdb::RowDataCollection,duckdb::BufferManager&,unsigned_long_const&,unsigned_int,bool>
                ((duckdb *)&local_d8,this->gstate->buffer_manager,(unsigned_long *)&handles,
                 &local_cc,&local_e9);
      pRVar5 = local_d8;
      local_d8 = (pointer)0x0;
      ::std::
      __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
      reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
             *)&this->strings,pRVar5);
      ::std::unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
      ::~unique_ptr((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                     *)&local_d8);
    }
    iVar8 = input_chunk->count;
    pSVar12 = FlatVector::IncrementalSelectionVector();
    LogicalType::LogicalType(&local_b0,POINTER);
    Vector::Vector(&addresses,&local_b0,0x800);
    LogicalType::~LogicalType(&local_b0);
    pRVar10 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
              ::operator->(this_01);
    puVar3 = (pRVar10->blocks).
             super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar4 = (pRVar10->blocks).
             super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar10 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
              ::operator->(this_01);
    RowDataCollection::Build
              (&handles,pRVar10,iVar8,(data_ptr_t *)addresses.data,(idx_t *)0x0,pSVar12);
    DataChunk::ToUnifiedFormat((DataChunk *)&input_data);
    col_data = input_data;
    string_heap = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                  ::operator*(&this->strings);
    RowOperations::Scatter
              (input_chunk,
               (UnifiedVectorFormat *)
               col_data.
               super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::UnifiedVectorFormat,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::UnifiedVectorFormat_*,_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
               .super__Head_base<0UL,_duckdb::UnifiedVectorFormat_*,_false>._M_head_impl,
               &this->payload_layout,&addresses,string_heap,pSVar12,iVar8);
    if ((this->payload_layout).all_constant == false) {
      uVar14 = (long)puVar3 - (long)puVar4 >> 3;
      while( true ) {
        pRVar10 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                  ::operator->(this_01);
        if ((ulong)((long)(pRVar10->blocks).
                          super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pRVar10->blocks).
                          super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                          .
                          super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar14) break;
        pRVar10 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                  ::operator->(this_01);
        this_05 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                  ::get<true>(&pRVar10->blocks,uVar14);
        this_06 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  ::operator->(this_05);
        pBVar13 = shared_ptr<duckdb::BlockHandle,_true>::operator->(&this_06->block);
        pBVar13->unswizzled = "PartitionLocalSinkState::Sink";
        uVar14 = uVar14 + 1;
      }
    }
    ::std::
    unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>::
    ~unique_ptr(&input_data.
                 super_unique_ptr<duckdb::UnifiedVectorFormat[],_std::default_delete<duckdb::UnifiedVectorFormat[]>_>
               );
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::~vector
              (&handles.super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>);
    Vector::~Vector(&addresses);
  }
  else {
    if ((this->local_sort).
        super_unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_>._M_t.
        super___uniq_ptr_impl<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>_>.
        _M_t.
        super__Tuple_impl<0UL,_duckdb::LocalSortState_*,_std::default_delete<duckdb::LocalSortState>_>
        .super__Head_base<0UL,_duckdb::LocalSortState_*,_false>._M_head_impl ==
        (LocalSortState *)0x0) {
      pDVar1 = &this->payload_chunk;
      DataChunk::Reset(pDVar1);
      pvVar11 = vector<duckdb::Vector,_true>::back(&pDVar1->data);
      Hash(this,input_chunk,pvVar11);
      for (uVar14 = 0;
          uVar14 < (ulong)(((long)(input_chunk->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(input_chunk->data).
                                 super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                 super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x68);
          uVar14 = uVar14 + 1) {
        pvVar11 = vector<duckdb::Vector,_true>::get<true>(&pDVar1->data,uVar14);
        other = vector<duckdb::Vector,_true>::get<true>(&input_chunk->data,uVar14);
        Vector::Reference(pvVar11,other);
      }
      (this->payload_chunk).count = input_chunk->count;
      PartitionGlobalSinkState::UpdateLocalPartition
                (this->gstate,&this->local_partition,&this->local_append);
      this_04 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
                ::operator->(&this->local_partition);
      state = unique_ptr<duckdb::PartitionedTupleDataAppendState,_std::default_delete<duckdb::PartitionedTupleDataAppendState>,_true>
              ::operator*(&this->local_append);
      pSVar12 = FlatVector::IncrementalSelectionVector();
      PartitionedTupleData::Append(this_04,state,pDVar1,pSVar12,0xffffffffffffffff);
      return;
    }
    this_00 = &this->local_sort;
    pDVar1 = &this->group_chunk;
    DataChunk::Reset(pDVar1);
    ExpressionExecutor::Execute(&this->executor,input_chunk,pDVar1);
    pLVar7 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>::
             operator->(this_00);
    LocalSortState::SinkChunk(pLVar7,pDVar1,input_chunk);
    this_02 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
              ::get<true>(&this->gstate->hash_groups,0);
    this_03 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
              ::operator*(this_02);
    LOCK();
    (this_03->count).super___atomic_base<unsigned_long>._M_i =
         (this_03->count).super___atomic_base<unsigned_long>._M_i + input_chunk->count;
    UNLOCK();
    pLVar7 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>::
             operator->(this_00);
    iVar8 = LocalSortState::SizeInBytes(pLVar7);
    if (this->gstate->memory_per_thread < iVar8) {
      global_sort_state =
           unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator*(&this_03->global_sort);
      pLVar7 = unique_ptr<duckdb::LocalSortState,_std::default_delete<duckdb::LocalSortState>,_true>
               ::operator->(this_00);
      LocalSortState::Sort(pLVar7,global_sort_state,true);
      return;
    }
  }
  return;
}

Assistant:

void PartitionLocalSinkState::Sink(DataChunk &input_chunk) {
	gstate.count += input_chunk.size();

	// OVER()
	if (sort_cols == 0) {
		//	No sorts, so build paged row chunks
		if (!rows) {
			const auto entry_size = payload_layout.GetRowWidth();
			const auto block_size = gstate.buffer_manager.GetBlockSize();
			const auto capacity = MaxValue<idx_t>(STANDARD_VECTOR_SIZE, block_size / entry_size + 1);
			rows = make_uniq<RowDataCollection>(gstate.buffer_manager, capacity, entry_size);
			strings = make_uniq<RowDataCollection>(gstate.buffer_manager, block_size, 1U, true);
		}
		const auto row_count = input_chunk.size();
		const auto row_sel = FlatVector::IncrementalSelectionVector();
		Vector addresses(LogicalType::POINTER);
		auto key_locations = FlatVector::GetData<data_ptr_t>(addresses);
		const auto prev_rows_blocks = rows->blocks.size();
		auto handles = rows->Build(row_count, key_locations, nullptr, row_sel);
		auto input_data = input_chunk.ToUnifiedFormat();
		RowOperations::Scatter(input_chunk, input_data.get(), payload_layout, addresses, *strings, *row_sel, row_count);
		// Mark that row blocks contain pointers (heap blocks are pinned)
		if (!payload_layout.AllConstant()) {
			D_ASSERT(strings->keep_pinned);
			for (size_t i = prev_rows_blocks; i < rows->blocks.size(); ++i) {
				rows->blocks[i]->block->SetSwizzling("PartitionLocalSinkState::Sink");
			}
		}
		return;
	}

	if (local_sort) {
		//	OVER(ORDER BY...)
		group_chunk.Reset();
		executor.Execute(input_chunk, group_chunk);
		local_sort->SinkChunk(group_chunk, input_chunk);

		auto &hash_group = *gstate.hash_groups[0];
		hash_group.count += input_chunk.size();

		if (local_sort->SizeInBytes() > gstate.memory_per_thread) {
			auto &global_sort = *hash_group.global_sort;
			local_sort->Sort(global_sort, true);
		}
		return;
	}

	// OVER(...)
	payload_chunk.Reset();
	auto &hash_vector = payload_chunk.data.back();
	Hash(input_chunk, hash_vector);
	for (idx_t col_idx = 0; col_idx < input_chunk.ColumnCount(); ++col_idx) {
		payload_chunk.data[col_idx].Reference(input_chunk.data[col_idx]);
	}
	payload_chunk.SetCardinality(input_chunk);

	gstate.UpdateLocalPartition(local_partition, local_append);
	local_partition->Append(*local_append, payload_chunk);
}